

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffnchk(fitsfile *fptr,int *status)

{
  long lVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  char local_b88 [8];
  char block [2881];
  int nullpos;
  int length;
  LONGLONG bytepos;
  long nblock;
  long ii;
  int *status_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if (fptr->Fptr->datastart == -1) {
      fptr_local._4_4_ = 0;
    }
    else {
      lVar1 = fptr->Fptr->datastart;
      lVar2 = fptr->Fptr->headstart[fptr->Fptr->curhdu];
      ffmbyt(fptr,fptr->Fptr->headstart[fptr->Fptr->curhdu],0,status);
      block[0xb38] = '\0';
      for (nblock = 0; nblock < (lVar1 - lVar2) / 0xb40; nblock = nblock + 1) {
        iVar3 = ffgbyt(fptr,0xb40,local_b88,status);
        if (0 < iVar3) {
          return 0;
        }
        sVar4 = strlen(local_b88);
        if ((int)sVar4 != 0xb40) {
          return (int)nblock * 0xb40 + (int)sVar4 + 1;
        }
      }
      fptr_local._4_4_ = 0;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffnchk(fitsfile *fptr,  /* I - FITS file pointer                     */
           int *status)     /* IO - error status                         */
/*
  function returns the position of the first null character (ASCII 0), if
  any, in the current header.  Null characters are illegal, but the other
  CFITSIO routines that read the header will not detect this error, because
  the null gets interpreted as a normal end of string character.
*/
{
    long ii, nblock;
    LONGLONG bytepos;
    int length, nullpos;
    char block[2881];
    
    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
        return(0);  /* Don't check a file that is just being created.  */
                    /* It cannot contain nulls since CFITSIO wrote it. */
    }
    else
    {
        /* calculate number of blocks in the header */
        nblock = (long) (( (fptr->Fptr)->datastart - 
                   (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] ) / 2880);
    }

    bytepos = (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu];
    ffmbyt(fptr, bytepos, REPORT_EOF, status);  /* move to read pos. */

    block[2880] = '\0';
    for (ii = 0; ii < nblock; ii++)
    {
        if (ffgbyt(fptr, 2880, block, status) > 0)
            return(0);   /* read error of some sort */

        length = strlen(block);
        if (length != 2880)
        {
            nullpos = (ii * 2880) + length + 1;
            return(nullpos);
        }
    }

    return(0);
}